

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

bool Js::JavascriptExceptionOperators::IsErrorInstance(Var thrownObject)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  BOOL BVar4;
  JavascriptError *this;
  undefined4 *puVar5;
  RecyclableObject *local_28;
  RecyclableObject *obj;
  Var thrownObject_local;
  TypeId typeId;
  
  if ((thrownObject == (Var)0x0) || (bVar2 = VarIs<Js::JavascriptError>(thrownObject), !bVar2)) {
    if ((thrownObject == (Var)0x0) || (bVar2 = VarIs<Js::RecyclableObject>(thrownObject), !bVar2)) {
LAB_00f7e8c5:
      thrownObject_local._3_1_ = false;
    }
    else {
      local_28 = VarTo<Js::RecyclableObject>(thrownObject);
      do {
        local_28 = Js::JavascriptOperators::GetPrototype(local_28);
        if (local_28 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                             ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        TVar3 = RecyclableObject::GetTypeId(local_28);
        if ((0x57 < (int)TVar3) && (BVar4 = RecyclableObject::IsExternal(local_28), BVar4 == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                             ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                             "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        if (TVar3 == TypeIds_Null) goto LAB_00f7e8c5;
        bVar2 = VarIs<Js::JavascriptError,Js::RecyclableObject>(local_28);
      } while (!bVar2);
      thrownObject_local._3_1_ = true;
    }
  }
  else {
    this = VarTo<Js::JavascriptError>(thrownObject);
    BVar4 = JavascriptError::IsPrototype(this);
    thrownObject_local._3_1_ = BVar4 == 0;
  }
  return thrownObject_local._3_1_;
}

Assistant:

bool JavascriptExceptionOperators::IsErrorInstance(Var thrownObject)
    {
        if (thrownObject && VarIs<JavascriptError>(thrownObject))
        {
            return !VarTo<JavascriptError>(thrownObject)->IsPrototype();
        }

        if (thrownObject && VarIs<RecyclableObject>(thrownObject))
        {
            RecyclableObject* obj = VarTo<RecyclableObject>(thrownObject);

            while (true)
            {
                obj = JavascriptOperators::GetPrototype(obj);
                if (JavascriptOperators::GetTypeId(obj) == TypeIds_Null)
                {
                    break;
                }

                if (VarIs<JavascriptError>(obj))
                {
                    return true;
                }
            }
        }

        return false;
    }